

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
local_vehicles(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int x,int y,
              vector<vehicle,_std::allocator<vehicle>_> *vehicles,int same)

{
  pointer pvVar1;
  undefined8 in_RAX;
  int iVar2;
  int iVar4;
  int iVar5;
  undefined8 uStack_38;
  int iVar3;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = 0;
  uStack_38 = in_RAX;
  while (uStack_38 = CONCAT44(iVar2,(undefined4)uStack_38), iVar2 < 0x19) {
    iVar3 = same;
    if ((iVar2 != same) &&
       (pvVar1 = (vehicles->super__Vector_base<vehicle,_std::allocator<vehicle>_>)._M_impl.
                 super__Vector_impl_data._M_start, iVar5 = pvVar1[iVar2].x - x,
       iVar4 = pvVar1[iVar2].y - y, iVar3 = iVar2, (uint)(iVar4 * iVar4 + iVar5 * iVar5) < 0x1440))
    {
      std::vector<int,_std::allocator<int>_>::push_back
                (__return_storage_ptr__,(value_type *)((long)&uStack_38 + 4));
      iVar3 = uStack_38._4_4_;
    }
    iVar2 = iVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> local_vehicles(int x, int y, vector<vehicle> vehicles, int same){
	vector<int> local;
	
	for (int i=0;i<numVehicles;i++){
		if (i != same){
			int xdiff = vehicles[i].x-x;
			int ydiff = vehicles[i].y-y;

			if (xdiff*xdiff + ydiff*ydiff <threshold*threshold){
				local.push_back(i);
			}
		}
	}
	return local;
}